

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallTargetGenerator::GetDestDirPath
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *file)

{
  char *pcVar1;
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *file_local;
  cmInstallTargetGenerator *this_local;
  string *toDestDirPath;
  
  local_21 = 0;
  local_20 = file;
  file_local = (string *)this;
  this_local = (cmInstallTargetGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"$ENV{DESTDIR}",&local_22);
  std::allocator<char>::~allocator(&local_22);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
  if ((*pcVar1 != '/') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_20), *pcVar1 != '$')) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestDirPath(std::string const& file)
{
  // Construct the path of the file on disk after installation on
  // which tweaks may be performed.
  std::string toDestDirPath = "$ENV{DESTDIR}";
  if (file[0] != '/' && file[0] != '$') {
    toDestDirPath += "/";
  }
  toDestDirPath += file;
  return toDestDirPath;
}